

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
::get_msgpack_string
          (binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           *this,string_t *result)

{
  size_t byte_;
  json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  anon_class_24_3_66f44b67 __gen;
  anon_class_24_3_66f44b67 __gen_00;
  anon_class_24_3_66f44b67 __gen_01;
  undefined1 *puVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  bool success;
  uint8_t len;
  string last_token;
  undefined1 local_c8 [16];
  string *local_b8 [3];
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  bVar2 = unexpect_eof(this,msgpack,"string");
  if (!bVar2) {
    return false;
  }
  uVar3 = this->current;
  local_c8._0_8_ = this;
  if (uVar3 - 0xa0 < 0x20) {
    uVar3 = uVar3 & 0x1f;
    psVar4 = &local_a0;
    local_a0._M_dataplus._M_p._0_1_ = 1;
  }
  else {
    if (uVar3 == 0xd9) {
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_char,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,msgpack,(uchar *)&local_80);
      if (!bVar2) {
        return false;
      }
      local_b8[0] = &local_60;
      local_60._M_dataplus._M_p._0_4_ = 2;
      psVar4 = &local_a0;
      local_a0._M_dataplus._M_p._0_1_ = 1;
      __gen_00.success = (bool *)psVar4;
      __gen_00.this = this;
      __gen_00.format = (input_format_t *)local_b8[0];
      local_c8._8_8_ = psVar4;
      std::
      generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_char,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_char>(nlohmann::detail::input_format_t,unsigned_char,std::__cxx11::string&)::_lambda()_1_>
                ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )result,(uchar)local_80._M_dataplus._M_p,__gen_00);
      goto LAB_00119c3a;
    }
    if (uVar3 == 0xda) {
      bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
              ::get_number<unsigned_short,false>
                        ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                          *)this,msgpack,(unsigned_short *)&local_a0);
      if (!bVar2) {
        return false;
      }
      local_b8[0] = &local_60;
      local_60._M_dataplus._M_p._0_4_ = 2;
      psVar4 = &local_80;
      local_80._M_dataplus._M_p._0_1_ = 1;
      __gen_01.success = (bool *)psVar4;
      __gen_01.this = this;
      __gen_01.format = (input_format_t *)local_b8[0];
      local_c8._8_8_ = psVar4;
      std::
      generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_short,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_short>(nlohmann::detail::input_format_t,unsigned_short,std::__cxx11::string&)::_lambda()_1_>
                ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )result,CONCAT11(local_a0._M_dataplus._M_p._1_1_,local_a0._M_dataplus._M_p._0_1_),
                 __gen_01);
      goto LAB_00119c3a;
    }
    if (uVar3 != 0xdb) {
      get_token_string(&local_60,this);
      byte_ = this->chars_read;
      this_00 = this->sax;
      std::operator+(&local_80,"expected length specification (0xA0-0xBF, 0xD9-0xDB); last byte: 0x"
                     ,&local_60);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string","");
      exception_message(&local_a0,this,msgpack,&local_80,&local_40);
      parse_error::create((parse_error *)local_c8,0x71,byte_,&local_a0);
      bVar2 = json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::parse_error(this_00,byte_,&local_60,(exception *)local_c8);
      local_c8._0_8_ = &PTR__exception_00131b48;
      std::runtime_error::~runtime_error((runtime_error *)local_b8);
      std::exception::~exception((exception *)local_c8);
      puVar1 = (undefined1 *)
               CONCAT44(local_a0._M_dataplus._M_p._4_4_,
                        CONCAT22(local_a0._M_dataplus._M_p._2_2_,
                                 CONCAT11(local_a0._M_dataplus._M_p._1_1_,
                                          local_a0._M_dataplus._M_p._0_1_)));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != &local_a0.field_2) {
        operator_delete(puVar1,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_80._M_dataplus._M_p._1_7_,(uchar)local_80._M_dataplus._M_p) !=
          &local_80.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_80._M_dataplus._M_p._1_7_,(uchar)local_80._M_dataplus._M_p),
                        local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                        local_60.field_2._M_allocated_capacity + 1);
        return bVar2;
      }
      return bVar2;
    }
    bVar2 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
            ::get_number<unsigned_int,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                        *)this,msgpack,(uint *)&local_a0);
    if (!bVar2) {
      return false;
    }
    uVar3 = CONCAT22(local_a0._M_dataplus._M_p._2_2_,
                     CONCAT11(local_a0._M_dataplus._M_p._1_1_,local_a0._M_dataplus._M_p._0_1_));
    psVar4 = &local_80;
    local_80._M_dataplus._M_p._0_1_ = '\x01';
  }
  local_b8[0] = &local_60;
  local_60._M_dataplus._M_p._0_4_ = 2;
  __gen.success = (bool *)psVar4;
  __gen.this = this;
  __gen.format = (input_format_t *)&local_60;
  local_c8._8_8_ = psVar4;
  std::
  generate_n<std::back_insert_iterator<std::__cxx11::string>,unsigned_int,nlohmann::detail::binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,nlohmann::detail::json_sax_dom_parser<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>::get_string<unsigned_int>(nlohmann::detail::input_format_t,unsigned_int,std::__cxx11::string&)::_lambda()_1_>
            ((back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )result,uVar3,__gen);
LAB_00119c3a:
  return (bool)*(undefined1 *)&(psVar4->_M_dataplus)._M_p;
}

Assistant:

bool get_msgpack_string(string_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(not unexpect_eof(input_format_t::msgpack, "string")))
        {
            return false;
        }

        switch (current)
        {
            // fixstr
            case 0xA0:
            case 0xA1:
            case 0xA2:
            case 0xA3:
            case 0xA4:
            case 0xA5:
            case 0xA6:
            case 0xA7:
            case 0xA8:
            case 0xA9:
            case 0xAA:
            case 0xAB:
            case 0xAC:
            case 0xAD:
            case 0xAE:
            case 0xAF:
            case 0xB0:
            case 0xB1:
            case 0xB2:
            case 0xB3:
            case 0xB4:
            case 0xB5:
            case 0xB6:
            case 0xB7:
            case 0xB8:
            case 0xB9:
            case 0xBA:
            case 0xBB:
            case 0xBC:
            case 0xBD:
            case 0xBE:
            case 0xBF:
            {
                return get_string(input_format_t::msgpack, static_cast<unsigned int>(current) & 0x1Fu, result);
            }

            case 0xD9: // str 8
            {
                std::uint8_t len;
                return get_number(input_format_t::msgpack, len) and get_string(input_format_t::msgpack, len, result);
            }

            case 0xDA: // str 16
            {
                std::uint16_t len;
                return get_number(input_format_t::msgpack, len) and get_string(input_format_t::msgpack, len, result);
            }

            case 0xDB: // str 32
            {
                std::uint32_t len;
                return get_number(input_format_t::msgpack, len) and get_string(input_format_t::msgpack, len, result);
            }

            default:
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::msgpack, "expected length specification (0xA0-0xBF, 0xD9-0xDB); last byte: 0x" + last_token, "string")));
            }
        }
    }